

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decompression.cpp
# Opt level: O1

ChunkHeader * __thiscall
Compressor::encodeChunk
          (ChunkHeader *__return_storage_ptr__,Compressor *this,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *output,Image *input,MaskRect bounds
          ,Point location,bool isSwitch)

{
  uint8_t uVar1;
  pointer pCVar2;
  uint8_t *puVar3;
  pointer puVar4;
  pointer puVar5;
  Impl *pIVar6;
  vector<MaskRect,_std::allocator<MaskRect>_> *pvVar7;
  Color *color;
  pointer pCVar8;
  pointer pCVar9;
  pointer *ppMVar10;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar11;
  ulong uVar12;
  long lVar13;
  iterator __position;
  vector<MaskRect,std::allocator<MaskRect>> *this_00;
  undefined1 auVar14 [16];
  int p2;
  int p1;
  Image sized;
  DefaultEncode local_61;
  MaskRect local_60;
  int local_58;
  int local_54;
  Image local_50;
  
  local_60 = bounds;
  Image::resizeClampToEdge
            (&local_50,input,
             (Size)((ulong)((input->size).width + 3U & 0xfffffffc) |
                   (ulong)input->size & 0xffffffff00000000));
  pCVar9 = local_50.colorData.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (!isSwitch) {
    for (; pCVar9 != local_50.colorData.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
                     super__Vector_impl_data._M_finish; pCVar9 = pCVar9 + 1) {
      uVar1 = pCVar9->b;
      pCVar9->b = pCVar9->r;
      pCVar9->r = uVar1;
    }
  }
  __return_storage_ptr__->type = TYPE_COLOR1;
  __return_storage_ptr__->size = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->transparentMasks).
           super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage + 2) = 0;
  __return_storage_ptr__->x = 0;
  __return_storage_ptr__->y = 0;
  __return_storage_ptr__->w = 0;
  __return_storage_ptr__->h = 0;
  (__return_storage_ptr__->masks).super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->masks).super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->masks).super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->transparentMasks).super__Vector_base<MaskRect,_std::allocator<MaskRect>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->transparentMasks).super__Vector_base<MaskRect,_std::allocator<MaskRect>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->transparentMasks).super__Vector_base<MaskRect,_std::allocator<MaskRect>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __return_storage_ptr__->x = (uint16_t)location.x;
  __return_storage_ptr__->y = (uint16_t)location.y;
  auVar14._8_8_ = 0;
  auVar14._0_4_ = (input->size).width;
  auVar14._4_4_ = (input->size).height;
  auVar14 = pshuflw(auVar14,auVar14,0xe8);
  __return_storage_ptr__->w = (short)auVar14._0_4_;
  __return_storage_ptr__->h = (short)((uint)auVar14._0_4_ >> 0x10);
  __return_storage_ptr__->size = 0;
  pCVar9 = (input->colorData).super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
           super__Vector_impl_data._M_start;
  pCVar2 = (input->colorData).super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
           super__Vector_impl_data._M_finish;
  lVar13 = (long)pCVar2 - (long)pCVar9 >> 4;
  pCVar8 = pCVar9;
  if (0 < lVar13) {
    pCVar8 = (pointer)(&pCVar9->r + ((long)pCVar2 - (long)pCVar9 & 0xfffffffffffffff0));
    lVar13 = lVar13 + 1;
    pCVar9 = pCVar9 + 2;
    do {
      if ((uint)pCVar9[-2] < 0xff000000) {
        pCVar9 = pCVar9 + -2;
        goto LAB_00107be9;
      }
      if ((uint)pCVar9[-1] < 0xff000000) {
        pCVar9 = pCVar9 + -1;
        goto LAB_00107be9;
      }
      if ((uint)*pCVar9 < 0xff000000) goto LAB_00107be9;
      if ((uint)pCVar9[1] < 0xff000000) {
        pCVar9 = pCVar9 + 1;
        goto LAB_00107be9;
      }
      lVar13 = lVar13 + -1;
      pCVar9 = pCVar9 + 4;
    } while (1 < lVar13);
  }
  lVar13 = (long)pCVar2 - (long)pCVar8 >> 2;
  if (lVar13 == 1) {
LAB_00107ba5:
    pCVar9 = pCVar8;
    if (0xfeffffff < (uint)*pCVar8) {
      pCVar9 = pCVar2;
    }
  }
  else if (lVar13 == 2) {
LAB_00107b99:
    pCVar9 = pCVar8;
    if (0xfeffffff < (uint)*pCVar8) {
      pCVar8 = pCVar8 + 1;
      goto LAB_00107ba5;
    }
  }
  else {
    pCVar9 = pCVar2;
    if ((lVar13 == 3) && (pCVar9 = pCVar8, 0xfeffffff < (uint)*pCVar8)) {
      pCVar8 = pCVar8 + 1;
      goto LAB_00107b99;
    }
  }
LAB_00107be9:
  if (pCVar9 == pCVar2) {
    __position._M_current =
         (__return_storage_ptr__->masks).super__Vector_base<MaskRect,_std::allocator<MaskRect>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (__return_storage_ptr__->masks).super__Vector_base<MaskRect,_std::allocator<MaskRect>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      this_00 = (vector<MaskRect,std::allocator<MaskRect>> *)&__return_storage_ptr__->masks;
      goto LAB_00107c24;
    }
    pvVar7 = &__return_storage_ptr__->masks;
  }
  else {
    __position._M_current =
         (__return_storage_ptr__->transparentMasks).
         super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl.super__Vector_impl_data.
         _M_finish;
    if (__position._M_current ==
        (__return_storage_ptr__->transparentMasks).
        super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      this_00 = (vector<MaskRect,std::allocator<MaskRect>> *)
                &__return_storage_ptr__->transparentMasks;
LAB_00107c24:
      std::vector<MaskRect,std::allocator<MaskRect>>::_M_realloc_insert<MaskRect_const&>
                (this_00,__position,&local_60);
      goto LAB_00107c2e;
    }
    pvVar7 = &__return_storage_ptr__->transparentMasks;
  }
  ppMVar10 = &(pvVar7->super__Vector_base<MaskRect,_std::allocator<MaskRect>_>)._M_impl.
              super__Vector_impl_data._M_finish;
  *__position._M_current = local_60;
  *ppMVar10 = *ppMVar10 + 1;
LAB_00107c2e:
  Impl::getPalettes(this->impl,&local_50,&local_54,&local_58);
  if (-1 < local_54) {
    pvVar11 = Impl::writePaletted(this->impl,&local_50,&this->impl->palette1,false);
    puVar3 = (pvVar11->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    local_61.isSwitch = isSwitch;
    LZ77Compressor::compress<LZ77Compressor::DefaultEncode&>
              (&this->impl->compressor,output,puVar3,
               *(int *)&(pvVar11->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
                        ._M_impl.super__Vector_impl_data._M_finish - (int)puVar3,&local_61);
    uVar12 = (long)(output->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(output->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                   _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(pvVar11->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                      _M_impl.super__Vector_impl_data._M_finish -
               (long)(pvVar11->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                     _M_impl.super__Vector_impl_data._M_start) < uVar12) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=(output,pvVar11);
    }
    else {
      __return_storage_ptr__->size = (uint32_t)uVar12;
    }
    __return_storage_ptr__->type = TYPE_INDEXED;
  }
  if ((pCVar9 != pCVar2) && (-1 < local_58)) {
    pvVar11 = Impl::writePaletted(this->impl,&local_50,&this->impl->palette2,true);
    puVar3 = (pvVar11->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    local_61.isSwitch = isSwitch;
    LZ77Compressor::compress<LZ77Compressor::DefaultEncode&>
              (&this->impl->compressor,&this->impl->scratch,puVar3,
               *(int *)&(pvVar11->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
                        ._M_impl.super__Vector_impl_data._M_finish - (int)puVar3,&local_61);
    puVar4 = (output->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    puVar5 = (output->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if ((puVar4 == puVar5) ||
       ((ulong)((long)(this->impl->scratch).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish -
               (long)(this->impl->scratch).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start) < (ulong)((long)puVar5 - (long)puVar4))) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                (output,&this->impl->scratch);
      __return_storage_ptr__->size =
           *(int *)&(output->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                    _M_impl.super__Vector_impl_data._M_finish -
           *(int *)&(output->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                    _M_impl.super__Vector_impl_data._M_start;
      __return_storage_ptr__->type = TYPE_INDEXED_ALPHA;
    }
  }
  if ((output->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_start ==
      (output->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    prepareWriteRGB(&this->impl->scratch,&local_50);
    pIVar6 = this->impl;
    puVar3 = (pIVar6->scratch).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    local_61.isSwitch = isSwitch;
    LZ77Compressor::compress<LZ77Compressor::DefaultEncode&>
              (&pIVar6->compressor,output,puVar3,
               *(int *)&(pIVar6->scratch).
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_finish - (int)puVar3,&local_61);
    __return_storage_ptr__->size =
         *(int *)&(output->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                  _M_impl.super__Vector_impl_data._M_finish -
         *(int *)&(output->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                  _M_impl.super__Vector_impl_data._M_start;
    __return_storage_ptr__->type = TYPE_COLOR;
  }
  if (local_50.colorData.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.colorData.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_50.colorData.super__Vector_base<Color,_std::allocator<Color>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.colorData.super__Vector_base<Color,_std::allocator<Color>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

ChunkHeader Compressor::encodeChunk(std::vector<uint8_t>& output, const Image& input, MaskRect bounds, Point location, bool isSwitch) {
	Image sized = input.resizeClampToEdge(align(input.size));
	if (!isSwitch) {
		swapBR(sized);
	}
	ChunkHeader header = {};
	header.x = location.x;
	header.y = location.y;
	header.w = input.size.width;
	header.h = input.size.height;
	header.size = 0;
	bool hasTransparent = std::any_of(input.colorData.begin(), input.colorData.end(), [](Color c){ return c.a != 255; });
	if (hasTransparent) {
		header.transparentMasks.push_back(bounds);
	} else {
		header.masks.push_back(bounds);
	}
	int p1, p2;
	impl->getPalettes(sized, p1, p2);
	if (p1 >= 0) {
		auto& img = impl->writePaletted(sized, impl->palette1, false);
		compress(output, img.data(), static_cast<int>(img.size()), isSwitch);
		if (img.size() < output.size()) {
			output = img;
		} else {
			header.size = output.size();
		}
		header.type = ChunkHeader::TYPE_INDEXED;
	}
	if (p2 >= 0 && hasTransparent) {
		auto& img = impl->writePaletted(sized, impl->palette2, true);
		compress(impl->scratch, img.data(), static_cast<int>(img.size()), isSwitch);
		if (output.empty() || output.size() > impl->scratch.size()) {
			output = impl->scratch;
			header.size = output.size();
			header.type = ChunkHeader::TYPE_INDEXED_ALPHA;
		}
	}

	if (output.empty()) {
		prepareWriteRGB(impl->scratch, sized);
		compress(output, impl->scratch.data(), impl->scratch.size(), isSwitch);
		header.size = output.size();
		header.type = ChunkHeader::TYPE_COLOR;
	}

	return header;
}